

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O3

KindMeta get_kind_meta(Kind kind)

{
  CharBuff *buff;
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  KindMeta KVar4;
  
  uVar3 = (ulong)kind;
  buff = new_buff(2);
  if (kind < 0x80) {
    append_chr(buff,(char)kind);
    pcVar1 = to_string(buff);
    recycle_buff(buff);
  }
  else {
    lVar2 = 8;
    pcVar1 = (char *)0x0;
    do {
      if (*(Kind *)((long)&kind_table[0x34].name + lVar2) == kind) {
        pcVar1 = *(char **)((long)&kind_table[0].kind + lVar2);
        goto LAB_00102d54;
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x358);
    uVar3 = 0xd1;
  }
LAB_00102d54:
  KVar4.name = pcVar1;
  KVar4._0_8_ = uVar3;
  return KVar4;
}

Assistant:

KindMeta get_kind_meta(Kind kind) {
    CharBuff *buff = new_buff(2);
    if (kind != NEWLINE && kind >= 0 && kind <= 127) {
        KindMeta *meta = malloc(sizeof(KindMeta));
        append_chr(buff, (char) kind);
        meta->kind = kind;
        meta->name = to_string(buff);
        recycle_buff(buff);
        return *meta;
    } else {
        for (int i = 0; i < kind_count; ++i) {
            if (kind_table[i].kind == kind) {
                return kind_table[i];
            }
        }
    }
    return EMPTY_KIND;
}